

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O0

mqd_t tester_mq_start(_Bool server,char *tester_mq_name,_Bool *err)

{
  undefined1 local_68 [8];
  mq_attr tester_mq_attrs;
  mqd_t queue;
  int tmp_err;
  _Bool *err_local;
  char *tester_mq_name_local;
  _Bool server_local;
  
  tester_mq_attrs.__pad[3]._4_4_ = 0;
  if (server) {
    tester_mq_attrs.__pad[3]._0_4_ = mq_open(tester_mq_name,0x40,0x1b6,0);
    if ((mqd_t)tester_mq_attrs.__pad[3] == -1) {
      if (err != (_Bool *)0x0) {
        *err = true;
      }
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                    ,"tester_mq_start");
      return -1;
    }
    tester_mq_attrs.__pad[3]._4_4_ = mq_getattr((mqd_t)tester_mq_attrs.__pad[3],(mq_attr *)local_68)
    ;
    if (tester_mq_attrs.__pad[3]._4_4_ == -1) {
      if (err != (_Bool *)0x0) {
        *err = true;
      }
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                    ,"tester_mq_start");
      return -1;
    }
    if (tester_mq_attrs.mq_maxmsg < 0x400) {
      if (err != (_Bool *)0x0) {
        *err = true;
      }
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                    ,"tester_mq_start");
      return -1;
    }
  }
  else {
    tester_mq_attrs.__pad[3]._0_4_ = mq_open(tester_mq_name,1);
    if ((mqd_t)tester_mq_attrs.__pad[3] == -1) {
      if (err != (_Bool *)0x0) {
        *err = true;
      }
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                    ,"tester_mq_start");
      return -1;
    }
  }
  return (mqd_t)tester_mq_attrs.__pad[3];
}

Assistant:

mqd_t tester_mq_start(bool server, const char *tester_mq_name, bool *err) {
    assert(tester_mq_name != NULL && err != NULL);

    int tmp_err = 0;
    mqd_t queue;

    if(server) {
        queue = mq_open(tester_mq_name, O_RDONLY | O_CREAT, TESTER_MQ_PERMISSIONS, NULL);
        INT_FAIL_IF(queue == -1);

        // resize queue message size if it is too small
        struct mq_attr tester_mq_attrs;
        tmp_err = mq_getattr(queue, &tester_mq_attrs);
        INT_FAIL_IF(tmp_err == -1);
        INT_FAIL_IF(tester_mq_attrs.mq_msgsize < (int)sizeof(tester_mq_msg));
    } else {
        queue = mq_open(tester_mq_name, O_WRONLY);
        INT_FAIL_IF(queue == -1);
    }
    assert(queue != -1);
    return queue;
}